

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O3

void __thiscall
CTcLibParserCmdline::CTcLibParserCmdline
          (CTcLibParserCmdline *this,CTcHostIfc *hostifc,CTcMake *mk,CRcResList *res_list,
          char *lib_name,char *lib_url)

{
  char *pcVar1;
  
  CTcLibParser::CTcLibParser(&this->super_CTcLibParser,lib_name);
  (this->super_CTcLibParser)._vptr_CTcLibParser = (_func_int **)&PTR__CTcLibParserCmdline_00308970;
  this->hostifc_ = hostifc;
  this->mk_ = mk;
  this->res_list_ = res_list;
  pcVar1 = lib_copy_str(lib_name);
  this->lib_name_ = pcVar1;
  pcVar1 = lib_copy_str(lib_url);
  this->lib_url_ = pcVar1;
  this->nodef_ = 0;
  return;
}

Assistant:

CTcLibParserCmdline(CTcHostIfc *hostifc, CTcMake *mk,
                        CRcResList *res_list,
                        const char *lib_name, const char *lib_url)
        : CTcLibParser(lib_name)
    {
        /* remember our host interface */
        hostifc_ = hostifc;

        /* remember our 'make' control object */
        mk_ = mk;

        /* remember our resource list container */
        res_list_ = res_list;

        /* remember the URL to the library */
        lib_name_ = lib_copy_str(lib_name);
        lib_url_ = lib_copy_str(lib_url);

        /* no "nodef" flag yet */
        nodef_ = FALSE;
    }